

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cpp
# Opt level: O1

unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
 __thiscall argo::utf8::utf8_to_json_string(utf8 *this,string *src)

{
  ulong uVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  long *plVar5;
  json_utf8_exception *this_00;
  uint uVar6;
  pointer *__ptr;
  char32_t uc;
  uint i;
  size_t src_index;
  ulong local_38;
  
  plVar5 = (long *)operator_new(0x20);
  *plVar5 = (long)(plVar5 + 2);
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  *(long **)this = plVar5;
  std::__cxx11::string::reserve((ulong)plVar5);
  if (src->_M_string_length != 0) {
    local_38 = 0;
    do {
      uVar1 = local_38 + 1;
      bVar2 = (src->_M_dataplus)._M_p[local_38];
      uc = (char32_t)bVar2;
      i = 1;
      uVar6 = (uint)bVar2;
      if ((((char)bVar2 < '\0') && (i = 2, (uVar6 & 0xffffffe0) != 0xc0)) &&
         (i = 3, (uVar6 & 0xfffffff0) != 0xe0)) {
        i = (uint)((uVar6 & 0xfffffff8) == 0xf0) << 2;
      }
      local_38 = uVar1;
      switch(i) {
      case 1:
        break;
      case 2:
        bVar2 = next_char(src,&local_38);
        uc = (uint)(bVar2 & 0x3f) | (uVar6 & 0x1f) << 6;
        break;
      case 3:
        bVar3 = next_char(src,&local_38);
        bVar4 = next_char(src,&local_38);
        uVar6 = (bVar2 & 0xf) << 0xc;
        goto LAB_00112bd5;
      case 4:
        bVar2 = next_char(src,&local_38);
        bVar3 = next_char(src,&local_38);
        bVar4 = next_char(src,&local_38);
        uVar6 = (bVar2 & 0x3f) << 0xc | (uVar6 & 7) << 0x12;
LAB_00112bd5:
        uc = (uint)(bVar4 & 0x3f) | (bVar3 & 0x3f) << 6 | uVar6;
        break;
      default:
        this_00 = (json_utf8_exception *)__cxa_allocate_exception(0xe0);
        json_utf8_exception::json_utf8_exception(this_00,invalid_utf8_sequence_length_e,i);
        __cxa_throw(this_00,&json_utf8_exception::typeinfo,std::exception::~exception);
      }
      if ((uint)uc < 0x100) {
        uVar6 = uc & 0xff;
        switch(uVar6) {
        case 8:
          break;
        case 9:
          break;
        case 10:
          break;
        case 0xb:
switchD_00112c0c_caseD_b:
          std::__cxx11::string::push_back((char)*(char **)this);
          goto LAB_00112ca3;
        case 0xc:
          break;
        case 0xd:
          break;
        default:
          if ((uVar6 != 0x5c) && (uVar6 != 0x22)) goto switchD_00112c0c_caseD_b;
        }
        std::__cxx11::string::append(*(char **)this);
      }
      else {
        if (0xffff < (uint)uc) {
          add_hex_string((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)this,((uint)(uc + L'\xffff0000') >> 10) + L'\xd800');
          uc = uc & 0x3ffU | 0xdc00;
        }
        add_hex_string((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)this,uc);
      }
LAB_00112ca3:
    } while (local_38 < src->_M_string_length);
  }
  return (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )this;
}

Assistant:

unique_ptr<string> utf8::utf8_to_json_string(const string &src)
{
    unique_ptr<string> res(new string);

    // We need at least the same number of characters as the source.
    res->reserve(src.size());

    size_t src_index = 0;

    while (src_index < src.size())
    {
        char32_t uc = src[src_index++] & 0xff;

        unsigned int l = utf8_length(uc);

        switch (l)
        {
        case 1:
            break;
        case 2:
            uc = ((uc << 6) & 0x7ff) | (next_char(src, src_index) & 0x3f);
            break;
        case 3:
            uc = ((uc << 12) & 0xffff) | ((next_char(src, src_index) << 6) & 0xfff);
            uc |= next_char(src, src_index) & 0x3f;
            break;
        case 4:
            uc = ((uc << 18) & 0x1fffff) | ((next_char(src, src_index) << 12) & 0x3ffff);
            uc |= (next_char(src, src_index) << 6) & 0xfff;
            uc |= next_char(src, src_index) & 0x3f;  
            break;
        default:
            throw json_utf8_exception(json_utf8_exception::invalid_utf8_sequence_length_e, l);
        }

        if (uc <= 0xff)
        {
            switch (uc)
            {
            case '"':
                *res += "\\\"";
                break;
            case '\\':
                *res += "\\\\";
                break;
            case '\b':
                *res += "\\b";
                break;
            case '\f':
                *res += "\\f";
                break;
            case '\n':
                *res += "\\n";
                break;
            case '\r':
                *res += "\\r";
                break;
            case '\t':
                *res += "\\t";
                break;
            default: 
                *res += static_cast<char>(uc);
            }
        }
        else if (uc <= 0xffff)
        {
            add_hex_string(res, uc);
        }
        else
        {
            uc -= 0x10000;
            add_hex_string(res, (uc >> 10) + 0xD800);
            add_hex_string(res, (uc & 0x3ff) + 0xDC00);
        }
    }

    return res;
}